

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepared_statement_verifier.cpp
# Opt level: O3

void __thiscall duckdb::PreparedStatementVerifier::Extract(PreparedStatementVerifier *this)

{
  unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true> *this_00;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> _Var1;
  _Head_base<0UL,_duckdb::SQLStatement_*,_false> _Var2;
  _Head_base<0UL,_duckdb::DropStatement_*,_false> _Var3;
  _Head_base<0UL,_duckdb::SQLStatement_*,_false> _Var4;
  _Head_base<0UL,_duckdb::PrepareStatement_*,_false> _Var5;
  type pSVar6;
  type node;
  pointer pSVar7;
  mapped_type *pmVar8;
  PrepareStatement *this_01;
  pointer pPVar9;
  ExecuteStatement *this_02;
  pointer pEVar10;
  DropStatement *this_03;
  pointer pDVar11;
  pointer pDVar12;
  pointer *__ptr;
  _Hash_node_base *p_Var13;
  string name;
  _Head_base<0UL,_duckdb::DropStatement_*,_false> local_78;
  _Head_base<0UL,_duckdb::SQLStatement_*,_false> local_70;
  _Head_base<0UL,_duckdb::PrepareStatement_*,_false> local_68;
  _Any_data local_60;
  _Manager_type local_50;
  code *local_48;
  _Any_data local_40;
  _Manager_type local_30;
  code *local_28;
  
  this_00 = &(this->super_StatementVerifier).statement;
  pSVar6 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>::
           operator*(this_00);
  node = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator*
                   (&pSVar6->node);
  local_60._8_8_ = 0;
  local_48 = ::std::
             _Function_handler<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/verification/prepared_statement_verifier.cpp:27:20)>
             ::_M_invoke;
  local_50 = ::std::
             _Function_handler<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/verification/prepared_statement_verifier.cpp:27:20)>
             ::_M_manager;
  local_40._8_8_ = 0;
  local_40._M_unused._M_function_pointer = ParsedExpressionIterator::DefaultRefCallback;
  local_28 = ::std::_Function_handler<void_(duckdb::TableRef_&),_void_(*)(duckdb::TableRef_&)>::
             _M_invoke;
  local_30 = ::std::_Function_handler<void_(duckdb::TableRef_&),_void_(*)(duckdb::TableRef_&)>::
             _M_manager;
  local_60._M_unused._M_object = this;
  ParsedExpressionIterator::EnumerateQueryNodeChildren
            (node,(function<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&)>
                   *)&local_60,(function<void_(duckdb::TableRef_&)> *)&local_40);
  if (local_30 != (_Manager_type)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  if (local_50 != (_Manager_type)0x0) {
    (*local_50)(&local_60,&local_60,__destroy_functor);
  }
  for (p_Var13 = (this->values)._M_h._M_before_begin._M_nxt; p_Var13 != (_Hash_node_base *)0x0;
      p_Var13 = p_Var13->_M_nxt) {
    pSVar7 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
             ::operator->(this_00);
    pmVar8 = ::std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&(pSVar7->super_SQLStatement).named_param_map,(key_type *)(p_Var13 + 1)
                         );
    *pmVar8 = 0;
  }
  local_60._M_unused._M_object = &local_50;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"__duckdb_verification_prepared_statement","");
  this_01 = (PrepareStatement *)operator_new(0xa0);
  PrepareStatement::PrepareStatement(this_01);
  local_68._M_head_impl = this_01;
  pPVar9 = unique_ptr<duckdb::PrepareStatement,_std::default_delete<duckdb::PrepareStatement>,_true>
           ::operator->((unique_ptr<duckdb::PrepareStatement,_std::default_delete<duckdb::PrepareStatement>,_true>
                         *)&local_68);
  ::std::__cxx11::string::_M_assign((string *)&pPVar9->name);
  _Var1._M_head_impl =
       (this_00->
       super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
       .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl;
  (this_00->super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
  )._M_t.
  super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>.
  super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl = (SelectStatement *)0x0;
  pPVar9 = unique_ptr<duckdb::PrepareStatement,_std::default_delete<duckdb::PrepareStatement>,_true>
           ::operator->((unique_ptr<duckdb::PrepareStatement,_std::default_delete<duckdb::PrepareStatement>,_true>
                         *)&local_68);
  _Var2._M_head_impl =
       (pPVar9->statement).
       super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
       super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
       super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl;
  (pPVar9->statement).
  super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
  super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
  super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl =
       &(_Var1._M_head_impl)->super_SQLStatement;
  if (_Var2._M_head_impl != (SQLStatement *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_SQLStatement + 8))();
  }
  this_02 = (ExecuteStatement *)operator_new(0xd0);
  ExecuteStatement::ExecuteStatement(this_02);
  local_70._M_head_impl = (SQLStatement *)this_02;
  pEVar10 = unique_ptr<duckdb::ExecuteStatement,_std::default_delete<duckdb::ExecuteStatement>,_true>
            ::operator->((unique_ptr<duckdb::ExecuteStatement,_std::default_delete<duckdb::ExecuteStatement>,_true>
                          *)&local_70);
  ::std::__cxx11::string::_M_assign((string *)&pEVar10->name);
  pEVar10 = unique_ptr<duckdb::ExecuteStatement,_std::default_delete<duckdb::ExecuteStatement>,_true>
            ::operator->((unique_ptr<duckdb::ExecuteStatement,_std::default_delete<duckdb::ExecuteStatement>,_true>
                          *)&local_70);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_M_move_assign(&(pEVar10->named_values)._M_h,&this->values);
  this_03 = (DropStatement *)operator_new(0x80);
  DropStatement::DropStatement(this_03);
  local_78._M_head_impl = this_03;
  pDVar11 = unique_ptr<duckdb::DropStatement,_std::default_delete<duckdb::DropStatement>,_true>::
            operator->((unique_ptr<duckdb::DropStatement,_std::default_delete<duckdb::DropStatement>,_true>
                        *)&local_78);
  pDVar12 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                      (&pDVar11->info);
  (pDVar12->super_ParseInfo).field_0x9 = 5;
  local_40._M_unused._M_object = &local_30;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,local_60._M_unused._M_object,
             local_60._8_8_ + (long)local_60._M_unused._0_8_);
  pDVar11 = unique_ptr<duckdb::DropStatement,_std::default_delete<duckdb::DropStatement>,_true>::
            operator->((unique_ptr<duckdb::DropStatement,_std::default_delete<duckdb::DropStatement>,_true>
                        *)&local_78);
  pDVar12 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                      (&pDVar11->info);
  ::std::__cxx11::string::operator=((string *)&pDVar12->name,(string *)&local_40);
  if ((_Manager_type *)local_40._M_unused._0_8_ != &local_30) {
    operator_delete(local_40._M_unused._M_object);
  }
  _Var5._M_head_impl = local_68._M_head_impl;
  local_68._M_head_impl = (PrepareStatement *)0x0;
  _Var2._M_head_impl =
       (this->prepare_statement).
       super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
       super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
       super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl;
  (this->prepare_statement).
  super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
  super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
  super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl =
       &(_Var5._M_head_impl)->super_SQLStatement;
  if (_Var2._M_head_impl != (SQLStatement *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_SQLStatement + 8))();
  }
  _Var4._M_head_impl = local_70._M_head_impl;
  local_70._M_head_impl = (SQLStatement *)0x0;
  _Var2._M_head_impl =
       (this->execute_statement).
       super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
       super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
       super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl;
  (this->execute_statement).
  super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
  super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
  super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl = _Var4._M_head_impl;
  if (_Var2._M_head_impl != (SQLStatement *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_SQLStatement + 8))();
  }
  _Var3._M_head_impl = local_78._M_head_impl;
  local_78._M_head_impl = (DropStatement *)0x0;
  _Var2._M_head_impl =
       (this->dealloc_statement).
       super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
       super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
       super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl;
  (this->dealloc_statement).
  super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
  super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
  super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl =
       &(_Var3._M_head_impl)->super_SQLStatement;
  if (_Var2._M_head_impl != (SQLStatement *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_SQLStatement + 8))();
    if (local_78._M_head_impl != (DropStatement *)0x0) {
      (*((local_78._M_head_impl)->super_SQLStatement)._vptr_SQLStatement[1])();
    }
  }
  if (local_70._M_head_impl != (SQLStatement *)0x0) {
    (*(local_70._M_head_impl)->_vptr_SQLStatement[1])();
  }
  if (local_68._M_head_impl != (PrepareStatement *)0x0) {
    (*((local_68._M_head_impl)->super_SQLStatement)._vptr_SQLStatement[1])();
  }
  if ((_Manager_type *)local_60._M_unused._0_8_ != &local_50) {
    operator_delete(local_60._M_unused._M_object);
  }
  return;
}

Assistant:

void PreparedStatementVerifier::Extract() {
	auto &select = *statement;
	// replace all the constants from the select statement and replace them with parameter expressions
	ParsedExpressionIterator::EnumerateQueryNodeChildren(
	    *select.node, [&](unique_ptr<ParsedExpression> &child) { ConvertConstants(child); });
	for (auto &kv : values) {
		statement->named_param_map[kv.first] = 0;
	}
	// create the PREPARE and EXECUTE statements
	string name = "__duckdb_verification_prepared_statement";
	auto prepare = make_uniq<PrepareStatement>();
	prepare->name = name;
	prepare->statement = std::move(statement);

	auto execute = make_uniq<ExecuteStatement>();
	execute->name = name;
	execute->named_values = std::move(values);

	auto dealloc = make_uniq<DropStatement>();
	dealloc->info->type = CatalogType::PREPARED_STATEMENT;
	dealloc->info->name = string(name);

	prepare_statement = std::move(prepare);
	execute_statement = std::move(execute);
	dealloc_statement = std::move(dealloc);
}